

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O1

int IDAQuadSensReInit(void *ida_mem,N_Vector *yQS0)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int error_code;
  long lVar4;
  long lVar5;
  char *msgfmt;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  auVar2 = _DAT_00134070;
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    iVar6 = -0x14;
    ida_mem = (IDAMem)0x0;
    error_code = -0x14;
    iVar3 = 0x794;
  }
  else if (*(int *)((long)ida_mem + 0x9c) == 0) {
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    iVar6 = -0x28;
    error_code = -0x28;
    iVar3 = 0x79e;
  }
  else if (*(int *)((long)ida_mem + 0x6c0) == 0) {
    msgfmt = "Forward sensitivity analysis for quadrature variables was not activated.";
    iVar6 = -0x32;
    error_code = -0x32;
    iVar3 = 0x7a7;
  }
  else {
    if (yQS0 != (N_Vector *)0x0) {
      iVar3 = *(int *)((long)ida_mem + 0xa0);
      lVar5 = (long)iVar3;
      if (0 < lVar5) {
        lVar1 = *(long *)((long)ida_mem + 0x7f8);
        lVar4 = lVar5 + -1;
        auVar7._8_4_ = (int)lVar4;
        auVar7._0_8_ = lVar4;
        auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
        lVar4 = 0;
        auVar7 = auVar7 ^ _DAT_00134070;
        auVar8 = _DAT_00134060;
        do {
          auVar10 = auVar8 ^ auVar2;
          if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                      auVar7._4_4_ < auVar10._4_4_) & 1)) {
            *(undefined8 *)(lVar1 + lVar4) = 0x3ff0000000000000;
          }
          if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
              auVar10._12_4_ <= auVar7._12_4_) {
            *(undefined8 *)(lVar1 + 8 + lVar4) = 0x3ff0000000000000;
          }
          lVar9 = auVar8._8_8_;
          auVar8._0_8_ = auVar8._0_8_ + 2;
          auVar8._8_8_ = lVar9 + 2;
          lVar4 = lVar4 + 0x10;
        } while ((ulong)(iVar3 + 1U >> 1) << 4 != lVar4);
      }
      iVar3 = N_VScaleVectorArray(lVar5,*(undefined8 *)((long)ida_mem + 0x7f8),yQS0,
                                  *(undefined8 *)((long)ida_mem + 0x400));
      if (iVar3 != 0) {
        return -0x1c;
      }
      *(undefined8 *)((long)ida_mem + 0x5d8) = 0;
      *(undefined8 *)((long)ida_mem + 0x5e8) = 0;
      *(undefined8 *)((long)ida_mem + 0x620) = 0;
      *(undefined4 *)((long)ida_mem + 0x110) = 1;
      return 0;
    }
    msgfmt = "yQS0 = NULL illegal parameter.";
    iVar6 = -0x16;
    ida_mem = (IDAMem)0x0;
    error_code = -0x16;
    iVar3 = 0x7b0;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar3,"IDAQuadSensReInit",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return iVar6;
}

Assistant:

int IDAQuadSensReInit(void* ida_mem, N_Vector* yQS0)
{
  IDAMem IDA_mem;
  int is, retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(IDA_PROFILER);

  /* Check if sensitivity analysis is active */
  if (!IDA_mem->ida_sensi)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_SENS);
  }

  /* Was sensitivity for quadrature already initialized? */
  if (!IDA_mem->ida_quadSensMallocDone)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_NO_QUADSENS);
  }

  /* Verify yQS0 parameter. */
  if (yQS0 == NULL)
  {
    IDAProcessError(NULL, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NULL_YQS0);
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_ILL_INPUT);
  }

  /* Error checking complete at this point. */

  /* Initialize phiQS[0] in the history array */
  for (is = 0; is < IDA_mem->ida_Ns; is++) { IDA_mem->ida_cvals[is] = ONE; }

  retval = N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals, yQS0,
                               IDA_mem->ida_phiQS[0]);
  if (retval != IDA_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
    return (IDA_VECTOROP_ERR);
  }

  /* Initialize all sensitivities related counters. */
  IDA_mem->ida_nrQSe  = 0;
  IDA_mem->ida_nrQeS  = 0;
  IDA_mem->ida_netfQS = 0;

  /* Everything all right, set the flags and return with success. */
  IDA_mem->ida_quadr_sensi = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(IDA_PROFILER);
  return (IDA_SUCCESS);
}